

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

vec3 __thiscall djb::microfacet::u2_to_h2(microfacet *this,vec2 *u,vec3 *wi,args *args)

{
  float_t fVar1;
  vec3 vVar2;
  vec3 local_e0;
  mat3 local_cc;
  vec3 local_a8 [2];
  float_t local_90;
  undefined1 local_88 [8];
  vec3 wm_std;
  vec3 local_68;
  vec3 local_58;
  undefined8 local_48;
  vec3 wi_std;
  args *args_local;
  vec3 *wi_local;
  vec2 *u_local;
  microfacet *this_local;
  vec3 wm;
  
  unique0x100000ea = args;
  vVar2 = djb::operator*(&args->minv,wi);
  local_68.z = vVar2.z;
  local_58.z = local_68.z;
  local_68._0_8_ = vVar2._0_8_;
  local_58.x = local_68.x;
  local_58.y = local_68.y;
  join_0x00001240_0x00001200_ = normalize(&local_58);
  fVar1 = wm_std._16_4_;
  local_48 = stack0xffffffffffffff88;
  wi_std.x = fVar1;
  (*(this->super_brdf)._vptr_brdf[0xc])(this,u,&local_48);
  local_90 = fVar1;
  wm_std.x = fVar1;
  transpose(&local_cc,&stack0xffffffffffffffc8->minv);
  vVar2 = djb::operator*(&local_cc,(vec3 *)local_88);
  local_e0.z = vVar2.z;
  local_a8[0].z = local_e0.z;
  local_e0._0_8_ = vVar2._0_8_;
  local_a8[0].x = local_e0.x;
  local_a8[0].y = local_e0.y;
  vVar2 = normalize(local_a8);
  return vVar2;
}

Assistant:

vec3
microfacet::u2_to_h2(const vec2 &u, const vec3 &wi, const args &args) const
{
	vec3 wi_std = normalize(args.minv * wi);
	vec3 wm_std = u2_to_h2_std(u, wi_std);
	vec3 wm = normalize(transpose(args.minv) * wm_std);

	return wm;
}